

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void ModulusHelper<unsigned_short,_char,_1>::
     ModulusThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (unsigned_short *t,char *u,unsigned_short *result)

{
  char cVar1;
  unsigned_short uVar2;
  
  cVar1 = *u;
  if (cVar1 == -1) {
    uVar2 = 0;
  }
  else {
    if (cVar1 == '\0') {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
    }
    uVar2 = (unsigned_short)((long)(ulong)*t % (long)(int)cVar1);
  }
  *result = uVar2;
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void ModulusThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if(u == 0)
            E::SafeIntOnDivZero();

        //trap corner case
        if (mod_corner_case<U, std::numeric_limits< U >::is_signed >::is_undefined(u))
        {
            result = 0;
            return;
        }

        result = (T)(t % u);
    }